

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O2

void __thiscall
kainjow::mustache::
delimiter_set<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
::delimiter_set(delimiter_set<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                *this)

{
  std::__cxx11::wstring::wstring
            ((wstring *)this,(wstring *)delimiter_set<std::__cxx11::wstring>::default_begin);
  std::__cxx11::wstring::wstring
            ((wstring *)&this->end,(wstring *)delimiter_set<std::__cxx11::wstring>::default_end);
  return;
}

Assistant:

delimiter_set()
        : begin(default_begin)
        , end(default_end)
    {}